

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

bool vk::isShaderStageSupported
               (VkPhysicalDeviceFeatures *deviceFeatures,VkShaderStageFlagBits stage)

{
  VkShaderStageFlagBits stage_local;
  VkPhysicalDeviceFeatures *deviceFeatures_local;
  
  if ((stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ||
     (stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)) {
    deviceFeatures_local._7_1_ = deviceFeatures->tessellationShader == 1;
  }
  else if (stage == VK_SHADER_STAGE_GEOMETRY_BIT) {
    deviceFeatures_local._7_1_ = deviceFeatures->geometryShader == 1;
  }
  else {
    deviceFeatures_local._7_1_ = true;
  }
  return deviceFeatures_local._7_1_;
}

Assistant:

bool isShaderStageSupported (const VkPhysicalDeviceFeatures& deviceFeatures, VkShaderStageFlagBits stage)
{
	if (stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT || stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		return deviceFeatures.tessellationShader == VK_TRUE;
	else if (stage == VK_SHADER_STAGE_GEOMETRY_BIT)
		return deviceFeatures.geometryShader == VK_TRUE;
	else
		return true;
}